

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.h
# Opt level: O0

bmp_header bmp_image::read_bmp_header(istream *input)

{
  bmp_header bVar1;
  istream *input_local;
  bmp_header result;
  
  input_local = (istream *)0x0;
  result.magic = 0;
  result._2_2_ = 0;
  result.file_size = 0;
  read<unsigned_short>(input,(unsigned_short *)&input_local);
  read<unsigned_int>(input,(uint *)((long)&input_local + 4));
  read<unsigned_int>(input,(uint *)&result);
  read<unsigned_int>(input,&result.file_size);
  bVar1._8_8_ = result._0_8_;
  bVar1._0_8_ = input_local;
  return bVar1;
}

Assistant:

static bmp_header read_bmp_header(std::istream& input)
    {
        bmp_header result{};

        read(input, result.magic);
        read(input, result.file_size);
        read(input, result.reserved);
        read(input, result.offset);

        return result;
    }